

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

void __thiscall pbrt::RealisticCamera::TestExitPupilBounds(RealisticCamera *this)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  const_reference pvVar5;
  float *pfVar6;
  long in_RDI;
  float fVar7;
  Float FVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 extraout_var [56];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  Vector3<float> VVar22;
  Bounds2<float> BVar23;
  Ray *in_stack_00000018;
  Ray *in_stack_00000020;
  RealisticCamera *in_stack_00000028;
  Ray testOut;
  Ray testRay;
  Point2f pd;
  Point2f u2;
  int i;
  Bounds2f pupilBounds;
  int pupilIndex;
  Float r;
  Point3f pFilm;
  Float u;
  Float filmDiagonal;
  char *in_stack_00000380;
  Float in_stack_00000388;
  Float in_stack_0000038c;
  RealisticCamera *in_stack_00000390;
  nullptr_t in_stack_fffffffffffffea8;
  FILE *__stream;
  Ray *in_stack_fffffffffffffeb0;
  Bounds2<float> *in_stack_fffffffffffffeb8;
  Bounds2<float> *in_stack_fffffffffffffec0;
  Point3f *in_stack_fffffffffffffec8;
  Ray *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffee8;
  Tuple2<pbrt::Point2,_float> local_70 [2];
  int local_60;
  Tuple2<pbrt::Point2,_float> local_5c;
  Tuple2<pbrt::Point2,_float> local_54;
  Bounds2<float> local_4c;
  int local_3c;
  int local_38;
  int local_34;
  float local_30;
  float local_2c;
  float local_20;
  Float local_c;
  undefined1 auVar17 [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar21 [56];
  
  local_c = FilmHandle::Diagonal((FilmHandle *)in_stack_fffffffffffffeb0);
  if ((TestExitPupilBounds()::rng == '\0') &&
     (iVar2 = __cxa_guard_acquire(&TestExitPupilBounds()::rng), iVar2 != 0)) {
    RNG::RNG(&TestExitPupilBounds::rng);
    __cxa_guard_release(&TestExitPupilBounds()::rng);
  }
  local_20 = RNG::Uniform<float>((RNG *)in_stack_fffffffffffffeb0);
  Point3<float>::Point3
            (&in_stack_fffffffffffffeb0->o,(float)((ulong)in_stack_fffffffffffffea8 >> 0x20),
             SUB84(in_stack_fffffffffffffea8,0),0.0);
  auVar18._0_4_ = local_c / 2.0;
  auVar18._4_12_ = SUB6012((undefined1  [60])0x0,0);
  local_30 = local_2c / auVar18._0_4_;
  sVar3 = pstd::
          vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>::
          size((vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>
                *)(in_RDI + 0x4c8));
  fVar7 = local_30;
  local_38 = (int)sVar3 + -1;
  sVar3 = pstd::
          vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>::
          size((vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>
                *)(in_RDI + 0x4c8));
  auVar18 = vcvtusi2ss_avx512f(auVar18,sVar3 - 1);
  auVar21 = ZEXT856(auVar18._8_8_);
  dVar9 = std::floor((double)(ulong)(uint)(fVar7 * auVar18._0_4_));
  local_3c = (int)SUB84(dVar9,0);
  auVar17 = extraout_var;
  piVar4 = std::min<int>(&local_38,&local_3c);
  local_34 = *piVar4;
  pvVar5 = pstd::
           vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>::
           operator[]((vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>
                       *)(in_RDI + 0x4c8),(long)local_34);
  local_4c.pMin.super_Tuple2<pbrt::Point2,_float> = (pvVar5->pMin).super_Tuple2<pbrt::Point2,_float>
  ;
  local_4c.pMax.super_Tuple2<pbrt::Point2,_float> = (pvVar5->pMax).super_Tuple2<pbrt::Point2,_float>
  ;
  iVar2 = local_34 + 1;
  sVar3 = pstd::
          vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>::
          size((vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>
                *)(in_RDI + 0x4c8));
  if (iVar2 < (int)sVar3) {
    pstd::vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>::
    operator[]((vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>
                *)(in_RDI + 0x4c8),(long)(local_34 + 1));
    BVar23 = Union<float>(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    auVar20._0_8_ = BVar23.pMax.super_Tuple2<pbrt::Point2,_float>;
    auVar20._8_56_ = auVar21;
    auVar14._0_8_ = BVar23.pMin.super_Tuple2<pbrt::Point2,_float>;
    auVar14._8_56_ = auVar17;
    local_5c = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar14._0_16_);
    local_54 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar20._0_16_);
    local_4c.pMin.super_Tuple2<pbrt::Point2,_float> = local_5c;
    local_4c.pMax.super_Tuple2<pbrt::Point2,_float> = local_54;
  }
  local_60 = 0;
  while( true ) {
    if (999 < local_60) {
      fprintf(_stderr,".");
      return;
    }
    fVar7 = RNG::Uniform<float>((RNG *)in_stack_fffffffffffffeb0);
    RNG::Uniform<float>((RNG *)in_stack_fffffffffffffeb0);
    Point2<float>::Point2
              ((Point2<float> *)in_stack_fffffffffffffeb0,
               (float)((ulong)in_stack_fffffffffffffea8 >> 0x20),SUB84(in_stack_fffffffffffffea8,0))
    ;
    auVar15._0_8_ =
         SampleUniformDiskConcentric((Point2f *)CONCAT44(fVar7,in_stack_fffffffffffffee8));
    auVar15._8_56_ = extraout_var_00;
    local_70[0] = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar15._0_16_);
    FVar8 = RearElementRadius((RealisticCamera *)0x698ec0);
    Tuple2<pbrt::Point2,float>::operator*=((Tuple2<pbrt::Point2,float> *)local_70,FVar8);
    auVar17 = (undefined1  [56])0x0;
    Point3<float>::Point3
              (&in_stack_fffffffffffffeb0->o,(float)((ulong)in_stack_fffffffffffffea8 >> 0x20),
               SUB84(in_stack_fffffffffffffea8,0),0.0);
    VVar22 = Point3<float>::operator-
                       ((Point3<float> *)in_stack_fffffffffffffec0,
                        (Point3<float> *)in_stack_fffffffffffffeb8);
    auVar16._0_8_ = VVar22.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar16._8_56_ = auVar17;
    vmovlpd_avx(auVar16._0_16_);
    MediumHandle::TaggedPointer((MediumHandle *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8)
    ;
    Ray::Ray(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
             (Vector3f *)in_stack_fffffffffffffec0,(Float)((ulong)in_stack_fffffffffffffeb8 >> 0x20)
             ,(MediumHandle *)in_stack_fffffffffffffeb0);
    Ray::Ray(in_stack_fffffffffffffeb0);
    FVar8 = TraceLensesFromFilm(in_stack_00000028,in_stack_00000020,in_stack_00000018);
    if (((FVar8 != 0.0) || (NAN(FVar8))) &&
       (bVar1 = Inside<float>((Point2<float> *)local_70,&local_4c), !bVar1)) break;
    local_60 = local_60 + 1;
  }
  dVar9 = (double)local_70[0].x;
  dVar10 = (double)local_70[0].y;
  __stream = _stderr;
  pfVar6 = Tuple2<pbrt::Point2,_float>::operator[]((Tuple2<pbrt::Point2,_float> *)&local_4c,0);
  dVar11 = (double)*pfVar6;
  pfVar6 = Tuple2<pbrt::Point2,_float>::operator[]((Tuple2<pbrt::Point2,_float> *)&local_4c,1);
  dVar12 = (double)*pfVar6;
  pfVar6 = Tuple2<pbrt::Point2,_float>::operator[]
                     (&local_4c.pMax.super_Tuple2<pbrt::Point2,_float>,0);
  dVar13 = (double)*pfVar6;
  pfVar6 = Tuple2<pbrt::Point2,_float>::operator[]
                     (&local_4c.pMax.super_Tuple2<pbrt::Point2,_float>,1);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar10;
  fprintf(__stream,"Aha! (%f,%f) went through, but outside bounds (%f,%f) - (%f,%f)\n",dVar9,dVar10,
          dVar11,dVar12,dVar13,(double)*pfVar6);
  sVar3 = pstd::
          vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>::
          size((vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>
                *)(in_RDI + 0x4c8));
  vcvtusi2ss_avx512f(auVar19,sVar3);
  auVar18 = (undefined1  [16])0x0;
  RenderExitPupil(in_stack_00000390,in_stack_0000038c,in_stack_00000388,in_stack_00000380);
  sVar3 = pstd::
          vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>::
          size((vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>
                *)(in_RDI + 0x4c8));
  vcvtusi2ss_avx512f(auVar18,sVar3);
  RenderExitPupil(in_stack_00000390,in_stack_0000038c,in_stack_00000388,in_stack_00000380);
  RenderExitPupil(in_stack_00000390,in_stack_0000038c,in_stack_00000388,in_stack_00000380);
  exit(0);
}

Assistant:

void RealisticCamera::TestExitPupilBounds() const {
    Float filmDiagonal = film.Diagonal();

    static RNG rng;

    Float u = rng.Uniform<Float>();
    Point3f pFilm(u * filmDiagonal / 2, 0, 0);

    Float r = pFilm.x / (filmDiagonal / 2);
    int pupilIndex = std::min<int>(exitPupilBounds.size() - 1,
                                   std::floor(r * (exitPupilBounds.size() - 1)));
    Bounds2f pupilBounds = exitPupilBounds[pupilIndex];
    if (pupilIndex + 1 < (int)exitPupilBounds.size())
        pupilBounds = Union(pupilBounds, exitPupilBounds[pupilIndex + 1]);

    // Now, randomly pick points on the aperture and see if any are outside
    // of pupil bounds...
    for (int i = 0; i < 1000; ++i) {
        Point2f u2{rng.Uniform<Float>(), rng.Uniform<Float>()};
        Point2f pd = SampleUniformDiskConcentric(u2);
        pd *= RearElementRadius();

        Ray testRay(pFilm, Point3f(pd.x, pd.y, 0.f) - pFilm);
        Ray testOut;
        if (!TraceLensesFromFilm(testRay, &testOut))
            continue;

        if (!Inside(pd, pupilBounds)) {
            fprintf(stderr,
                    "Aha! (%f,%f) went through, but outside bounds (%f,%f) - "
                    "(%f,%f)\n",
                    pd.x, pd.y, pupilBounds.pMin[0], pupilBounds.pMin[1],
                    pupilBounds.pMax[0], pupilBounds.pMax[1]);
            RenderExitPupil(
                (Float)pupilIndex / exitPupilBounds.size() * filmDiagonal / 2.f, 0.f,
                "low.exr");
            RenderExitPupil(
                (Float)(pupilIndex + 1) / exitPupilBounds.size() * filmDiagonal / 2.f,
                0.f, "high.exr");
            RenderExitPupil(pFilm.x, 0.f, "mid.exr");
            exit(0);
        }
    }
    fprintf(stderr, ".");
}